

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

int run_test_thread_rwlock_trylock(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_3;
  uv_thread_t thread;
  
  iVar1 = uv_cond_init(&condvar);
  thread = (uv_thread_t)iVar1;
  if (thread == 0) {
    iVar1 = uv_mutex_init(&mutex);
    thread = (uv_thread_t)iVar1;
    if (thread == 0) {
      iVar1 = uv_rwlock_init(&rwlock);
      thread = (uv_thread_t)iVar1;
      if (thread == 0) {
        uv_mutex_lock(&mutex);
        iVar1 = uv_thread_create(&thread,thread_rwlock_trylock_peer,0);
        eval_b = (int64_t)iVar1;
        eval_b_3 = 0;
        if (eval_b == 0) {
          iVar1 = uv_rwlock_trywrlock(&rwlock);
          eval_b = (int64_t)iVar1;
          eval_b_3 = 0;
          if (eval_b == 0) {
            synchronize();
            uv_rwlock_wrunlock(&rwlock);
            iVar1 = uv_rwlock_tryrdlock(&rwlock);
            eval_b = (int64_t)iVar1;
            eval_b_3 = 0;
            if (eval_b == 0) {
              synchronize();
              uv_rwlock_rdunlock(&rwlock);
              synchronize();
              eval_b = -0x10;
              iVar1 = uv_rwlock_tryrdlock(&rwlock);
              eval_b_3 = (int64_t)iVar1;
              if (eval_b_3 == -0x10) {
                eval_b = -0x10;
                iVar1 = uv_rwlock_trywrlock(&rwlock);
                eval_b_3 = (int64_t)iVar1;
                if (eval_b_3 == -0x10) {
                  synchronize();
                  iVar1 = uv_rwlock_tryrdlock(&rwlock);
                  eval_b = (int64_t)iVar1;
                  eval_b_3 = 0;
                  if (eval_b == 0) {
                    uv_rwlock_rdunlock(&rwlock);
                    eval_b = -0x10;
                    iVar1 = uv_rwlock_trywrlock(&rwlock);
                    eval_b_3 = (int64_t)iVar1;
                    if (eval_b_3 == -0x10) {
                      synchronize();
                      iVar1 = uv_thread_join(&thread);
                      eval_b = (int64_t)iVar1;
                      eval_b_3 = 0;
                      if (eval_b == 0) {
                        uv_rwlock_destroy(&rwlock);
                        uv_mutex_unlock(&mutex);
                        uv_mutex_destroy(&mutex);
                        uv_cond_destroy(&condvar);
                        return 0;
                      }
                      pcVar4 = "0";
                      pcVar3 = "uv_thread_join(&thread)";
                      uVar2 = 0xaf;
                    }
                    else {
                      pcVar4 = "uv_rwlock_trywrlock(&rwlock)";
                      pcVar3 = "UV_EBUSY";
                      uVar2 = 0xac;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "uv_rwlock_tryrdlock(&rwlock)";
                    uVar2 = 0xaa;
                  }
                }
                else {
                  pcVar4 = "uv_rwlock_trywrlock(&rwlock)";
                  pcVar3 = "UV_EBUSY";
                  uVar2 = 0xa6;
                }
              }
              else {
                pcVar4 = "uv_rwlock_tryrdlock(&rwlock)";
                pcVar3 = "UV_EBUSY";
                uVar2 = 0xa5;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_rwlock_tryrdlock(&rwlock)";
              uVar2 = 0x9d;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_rwlock_trywrlock(&rwlock)";
            uVar2 = 0x96;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_thread_create(&thread, thread_rwlock_trylock_peer, ((void*)0))";
          uVar2 = 0x93;
        }
        goto LAB_0015c145;
      }
      pcVar3 = "uv_rwlock_init(&rwlock)";
      uVar2 = 0x90;
    }
    else {
      pcVar3 = "uv_mutex_init(&mutex)";
      uVar2 = 0x8f;
    }
  }
  else {
    pcVar3 = "uv_cond_init(&condvar)";
    uVar2 = 0x8e;
  }
  pcVar4 = "0";
  eval_b_3 = 0;
  eval_b = thread;
LAB_0015c145:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(thread_rwlock_trylock) {
  uv_thread_t thread;

  ASSERT_OK(uv_cond_init(&condvar));
  ASSERT_OK(uv_mutex_init(&mutex));
  ASSERT_OK(uv_rwlock_init(&rwlock));

  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_thread_create(&thread, thread_rwlock_trylock_peer, NULL));

  /* Hold write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();  /* Releases the mutex to the other thread. */

  /* Release write lock and acquire read lock.  Pthreads doesn't support
   * the notion of upgrading or downgrading rwlocks, so neither do we.
   */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  /* Release read lock. */
  uv_rwlock_rdunlock(&rwlock);
  synchronize();

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  ASSERT_OK(uv_thread_join(&thread));
  uv_rwlock_destroy(&rwlock);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&condvar);

  return 0;
}